

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSTL.cpp
# Opt level: O3

void __thiscall
adios2::format::BufferSTL::Reset(BufferSTL *this,bool resetAbsolutePosition,bool zeroInitialize)

{
  pointer pcVar1;
  size_t sVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  pointer pcVar4;
  ulong uVar5;
  
  (this->super_Buffer).m_Position = 0;
  if ((int)CONCAT71(in_register_00000031,resetAbsolutePosition) != 0) {
    (this->super_Buffer).m_AbsolutePosition = 0;
  }
  if (zeroInitialize) {
    pcVar4 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar4 == pcVar1) {
      return;
    }
    sVar2 = (long)pcVar1 - (long)pcVar4;
  }
  else {
    pcVar4 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar4;
    if (uVar5 != 0) {
      sVar2 = 0x400;
      if (uVar5 < 0x400) {
        sVar2 = uVar5;
      }
      memset(pcVar4,0,sVar2);
    }
    if (uVar5 < 0x401) {
      return;
    }
    uVar3 = 0x400;
    if (0x400 < uVar5 - 0x400) {
      uVar3 = uVar5 - 0x400;
    }
    sVar2 = uVar5 - uVar3;
    pcVar4 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + uVar3;
  }
  memset(pcVar4,0,sVar2);
  return;
}

Assistant:

void BufferSTL::Reset(const bool resetAbsolutePosition, const bool zeroInitialize)
{
    m_Position = 0;
    if (resetAbsolutePosition)
    {
        m_AbsolutePosition = 0;
    }
    if (zeroInitialize)
    {
        std::fill(m_Buffer.begin(), m_Buffer.end(), 0);
    }
    else
    {
        // just zero out the first and last 1kb
        const size_t bufsize = m_Buffer.size();
        size_t s = (bufsize < 1024 ? bufsize : 1024);
        std::fill_n(m_Buffer.begin(), s, 0);
        if (bufsize > 1024)
        {
            size_t pos = bufsize - 1024;
            if (pos < 1024)
            {
                pos = 1024;
            }
            s = bufsize - pos;
            std::fill_n(next(m_Buffer.begin(), pos), s, 0);
        }
    }
}